

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfMemory.c
# Opt level: O2

void * sbfMemory_realloc(void *ptr,size_t nmemb,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  
  if (size * nmemb == 0) {
    sbfFatal_die("zero size");
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = nmemb;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = size;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    pvVar3 = realloc(ptr,size * nmemb);
    if (pvVar3 != (void *)0x0) {
      return pvVar3;
    }
    sbfFatal_die("out of memory");
  }
  sbfFatal_die("size too big");
}

Assistant:

void*
sbfMemory_realloc (void* ptr, size_t nmemb, size_t size)
{
    size_t newsize;

    newsize = nmemb * size;
    if (newsize == 0)
        SBF_FATAL ("zero size");
    if (SIZE_MAX / nmemb < size)
        SBF_FATAL ("size too big");

    ptr = realloc (ptr, newsize);
    if (ptr == NULL)
        SBF_FATAL ("out of memory");
    return ptr;
}